

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::PerfEventConfig_CallstackSampling::~PerfEventConfig_CallstackSampling
          (PerfEventConfig_CallstackSampling *this)

{
  PerfEventConfig_CallstackSampling *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__PerfEventConfig_CallstackSampling_009c1538;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  protozero::CopyablePtr<perfetto::protos::gen::PerfEventConfig_Scope>::~CopyablePtr(&this->scope_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

PerfEventConfig_CallstackSampling::~PerfEventConfig_CallstackSampling() = default;